

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_named_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte local_41;
  uchar bit;
  byte *pbStack_40;
  uchar cur_byte_shifted;
  uchar *cur_byte;
  size_t byte_len;
  size_t unused_bits;
  size_t bits_local;
  uchar *buf_local;
  uchar *start_local;
  uchar **p_local;
  
  uVar3 = bits + 7 >> 3;
  unused_bits = bits;
  if (bits != 0) {
    local_41 = (byte)((int)(uint)buf[uVar3 - 1] >> ((char)uVar3 * '\b' - (char)bits & 0x1fU));
    pbStack_40 = buf + (uVar3 - 1);
    while ((bVar1 = local_41 & 1, local_41 = (byte)((int)(uint)local_41 >> 1), bVar1 == 0 &&
           (unused_bits = unused_bits - 1, unused_bits != 0))) {
      if ((unused_bits & 7) == 0) {
        local_41 = pbStack_40[-1];
        pbStack_40 = pbStack_40 + -1;
      }
    }
  }
  iVar2 = mbedtls_asn1_write_bitstring(p,start,buf,unused_bits);
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_named_bitstring( unsigned char **p,
                                        unsigned char *start,
                                        const unsigned char *buf,
                                        size_t bits )
{
    size_t unused_bits, byte_len;
    const unsigned char *cur_byte;
    unsigned char cur_byte_shifted;
    unsigned char bit;

    byte_len = ( bits + 7 ) / 8;
    unused_bits = ( byte_len * 8 ) - bits;

    /*
     * Named bitstrings require that trailing 0s are excluded in the encoding
     * of the bitstring. Trailing 0s are considered part of the 'unused' bits
     * when encoding this value in the first content octet
     */
    if( bits != 0 )
    {
        cur_byte = buf + byte_len - 1;
        cur_byte_shifted = *cur_byte >> unused_bits;

        for( ; ; )
        {
            bit = cur_byte_shifted & 0x1;
            cur_byte_shifted >>= 1;

            if( bit != 0 )
                break;

            bits--;
            if( bits == 0 )
                break;

            if( bits % 8 == 0 )
                cur_byte_shifted = *--cur_byte;
        }
    }

    return( mbedtls_asn1_write_bitstring( p, start, buf, bits ) );
}